

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR eval_unary_expr(lyxp_expr *exp,uint32_t *tok_idx,uint32_t repeat,lyxp_set *set,
                      uint32_t options)

{
  uint uVar1;
  LY_ERR LVar2;
  char *pcVar3;
  char *pcVar4;
  LY_ERR ret___1;
  LY_ERR ret__;
  uint32_t i;
  uint32_t this_op;
  LY_ERR rc;
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t repeat_local;
  uint32_t *tok_idx_local;
  lyxp_expr *exp_local;
  
  if (repeat == 0) {
    __assert_fail("repeat",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x239d,
                  "LY_ERR eval_unary_expr(const struct lyxp_expr *, uint32_t *, uint32_t, struct lyxp_set *, uint32_t)"
                 );
  }
  uVar1 = *tok_idx;
  ret___1 = LY_SUCCESS;
  while( true ) {
    if (repeat <= ret___1) {
      exp_local._4_4_ = eval_expr_select(exp,tok_idx,LYXP_EXPR_UNARY,set,options);
      if (exp_local._4_4_ == LY_SUCCESS) {
        if (((options & 0x20) == 0) && ((repeat & 1) != 0)) {
          if ((options & 0x1c) == 0) {
            LVar2 = moveto_op_math(set,(lyxp_set *)0x0,exp->expr + exp->tok_pos[uVar1]);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
          }
          else {
            warn_operands(set->ctx,set,(lyxp_set *)0x0,'\x01',exp->expr,exp->tok_pos[uVar1]);
          }
        }
        exp_local._4_4_ = LY_SUCCESS;
      }
      return exp_local._4_4_;
    }
    LVar2 = lyxp_check_token((ly_ctx *)0x0,exp,*tok_idx,LYXP_TOKEN_OPER_MATH);
    if ((LVar2 != LY_SUCCESS) || (exp->expr[exp->tok_pos[*tok_idx]] != '-')) break;
    pcVar3 = "parsed";
    if ((options & 0x20) != 0) {
      pcVar3 = "skipped";
    }
    pcVar4 = lyxp_token2str(exp->tokens[*tok_idx]);
    ly_log_dbg(2,"%-27s %s %s[%u]","eval_unary_expr",pcVar3,pcVar4,(ulong)exp->tok_pos[*tok_idx]);
    *tok_idx = *tok_idx + 1;
    ret___1 = ret___1 + LY_EMEM;
  }
  __assert_fail("!lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_MATH) && (exp->expr[exp->tok_pos[*tok_idx]] == \'-\')"
                ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                0x23a2,
                "LY_ERR eval_unary_expr(const struct lyxp_expr *, uint32_t *, uint32_t, struct lyxp_set *, uint32_t)"
               );
}

Assistant:

static LY_ERR
eval_unary_expr(const struct lyxp_expr *exp, uint32_t *tok_idx, uint32_t repeat, struct lyxp_set *set, uint32_t options)
{
    LY_ERR rc;
    uint32_t this_op, i;

    assert(repeat);

    /* ('-')+ */
    this_op = *tok_idx;
    for (i = 0; i < repeat; ++i) {
        assert(!lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_MATH) && (exp->expr[exp->tok_pos[*tok_idx]] == '-'));

        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
        ++(*tok_idx);
    }

    rc = eval_expr_select(exp, tok_idx, LYXP_EXPR_UNARY, set, options);
    LY_CHECK_RET(rc);

    if (!(options & LYXP_SKIP_EXPR) && (repeat % 2)) {
        if (options & LYXP_SCNODE_ALL) {
            warn_operands(set->ctx, set, NULL, 1, exp->expr, exp->tok_pos[this_op]);
        } else {
            rc = moveto_op_math(set, NULL, &exp->expr[exp->tok_pos[this_op]]);
            LY_CHECK_RET(rc);
        }
    }

    return LY_SUCCESS;
}